

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortA.c
# Opt level: O1

void burstsortA(string *strings,size_t scnt)

{
  int iVar1;
  byte *pbVar2;
  string puVar3;
  byte bVar4;
  TRIE_conflict *node;
  char **ppcVar5;
  TRIE_conflict *pTVar6;
  char *pcVar7;
  uint uVar8;
  byte bVar9;
  long lVar10;
  TRIE_conflict *pTVar11;
  char cVar12;
  ulong uVar13;
  ulong uVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  
  node = (TRIE_conflict *)calloc(1,0xd08);
  if (0 < (int)(uint)scnt) {
    uVar17 = 0;
    uVar14 = 0;
    do {
      pbVar2 = strings[uVar17];
      uVar13 = (ulong)*pbVar2;
      bVar9 = 0;
      uVar8 = node->counts[uVar13];
      pTVar11 = node;
      while ((int)uVar8 < 0) {
        pTVar11 = (TRIE_conflict *)pTVar11->ptrs[uVar13];
        bVar9 = bVar9 + 1;
        uVar13 = (ulong)pbVar2[bVar9];
        uVar8 = pTVar11->counts[uVar13];
      }
      cVar12 = (char)uVar13;
      if (uVar8 == 0) {
        if (cVar12 == '\0') {
          ppcVar5 = (char **)calloc(0x2000,8);
          pTVar11->ptrs[uVar13] = ppcVar5;
          if (ppcVar5 == (char **)0x0) goto LAB_001d7d1b;
          pTVar11->nulltailptr = ppcVar5;
          *ppcVar5 = (char *)strings[uVar17];
          pTVar11->nulltailptr = pTVar11->nulltailptr + 1;
          pTVar11->counts[uVar13] = 1;
        }
        else {
          ppcVar5 = (char **)calloc(0x10,8);
          pTVar11->ptrs[uVar13] = ppcVar5;
          if (ppcVar5 == (char **)0x0) {
LAB_001d7d1b:
            puts("Error: Out of memory ");
            exit(1);
          }
          puVar3 = strings[uVar17];
          pTVar11->counts[uVar13] = 1;
          *ppcVar5 = (char *)puVar3;
          pTVar11->levels[uVar13] = pTVar11->levels[uVar13] + '\x01';
        }
      }
      else {
        if (cVar12 == '\0') {
          *pTVar11->nulltailptr = (char *)pbVar2;
          ppcVar5 = pTVar11->nulltailptr;
          pTVar11->nulltailptr = ppcVar5 + 1;
          pTVar11->counts[uVar13] = uVar8 + 1;
          if ((uVar8 + 1) * -0x4002001 < 0x80041) {
            pcVar7 = (char *)calloc(0x2000,8);
            ppcVar5[1] = pcVar7;
            if (pcVar7 == (char *)0x0) goto LAB_001d7d1b;
            pTVar11->nulltailptr = (char **)*pTVar11->nulltailptr;
          }
        }
        else {
          ppcVar5 = pTVar11->ptrs[uVar13];
          pTVar11->counts[uVar13] = uVar8 + 1;
          ppcVar5[uVar8] = (char *)pbVar2;
          if ((uVar8 < 0x1fff) && ((int)(bucket_inc[pTVar11->levels[uVar13]] - 1) <= (int)uVar8)) {
            ppcVar5 = pTVar11->ptrs[uVar13];
            bVar4 = pTVar11->levels[uVar13] + 1;
            pTVar11->levels[uVar13] = bVar4;
            ppcVar5 = (char **)realloc(ppcVar5,(ulong)bucket_inc[bVar4] << 3);
            pTVar11->ptrs[uVar13] = ppcVar5;
            if (ppcVar5 == (char **)0x0) goto LAB_001d7d1b;
          }
        }
        if (cVar12 != '\0') {
          uVar8 = pTVar11->counts[uVar13];
          if (0x1fff < (int)uVar8) {
            piVar15 = pTVar11->counts + uVar13;
            do {
              pTVar6 = (TRIE_conflict *)calloc(1,0xd08);
              if (pTVar6 == (TRIE_conflict *)0x0) goto LAB_001d7d1b;
              bVar9 = bVar9 + 1;
              if (0 < (int)uVar8) {
                uVar16 = 0;
                do {
                  pcVar7 = pTVar11->ptrs[uVar13][uVar16];
                  bVar4 = pcVar7[bVar9];
                  uVar14 = (ulong)bVar4;
                  iVar1 = pTVar6->counts[uVar14];
                  lVar10 = (long)iVar1;
                  if (lVar10 < 1) {
                    if (bVar4 == 0) {
                      ppcVar5 = (char **)calloc(0x2000,8);
                      pTVar6->ptrs[uVar14] = ppcVar5;
                      if (ppcVar5 == (char **)0x0) goto LAB_001d7d1b;
                      pTVar6->nulltailptr = ppcVar5;
                      *ppcVar5 = pTVar11->ptrs[uVar13][uVar16];
                      pTVar6->nulltailptr = ppcVar5 + 1;
                      pTVar6->counts[uVar14] = iVar1 + 1;
                    }
                    else {
                      ppcVar5 = (char **)calloc(0x10,8);
                      pTVar6->ptrs[uVar14] = ppcVar5;
                      if (ppcVar5 == (char **)0x0) goto LAB_001d7d1b;
                      pcVar7 = pTVar11->ptrs[uVar13][uVar16];
                      pTVar6->counts[uVar14] = iVar1 + 1;
                      ppcVar5[lVar10] = pcVar7;
                      pTVar6->levels[uVar14] = pTVar6->levels[uVar14] + '\x01';
                    }
                  }
                  else if (bVar4 == 0) {
                    *pTVar6->nulltailptr = pcVar7;
                    ppcVar5 = pTVar6->nulltailptr;
                    pTVar6->nulltailptr = ppcVar5 + 1;
                    pTVar6->counts[uVar14] = iVar1 + 1;
                    if ((uint)((iVar1 + 1) * -0x4002001) < 0x80041) {
                      pcVar7 = (char *)calloc(0x2000,8);
                      ppcVar5[1] = pcVar7;
                      if (pcVar7 == (char *)0x0) goto LAB_001d7d1b;
                      pTVar6->nulltailptr = (char **)*pTVar6->nulltailptr;
                    }
                  }
                  else {
                    ppcVar5 = pTVar6->ptrs[uVar14];
                    pTVar6->counts[uVar14] = iVar1 + 1;
                    ppcVar5[lVar10] = pcVar7;
                    if ((iVar1 < 0x1fff) && ((int)(bucket_inc[pTVar6->levels[uVar14]] - 1) <= iVar1)
                       ) {
                      ppcVar5 = pTVar6->ptrs[uVar14];
                      bVar4 = pTVar6->levels[uVar14] + 1;
                      pTVar6->levels[uVar14] = bVar4;
                      ppcVar5 = (char **)realloc(ppcVar5,(ulong)bucket_inc[bVar4] << 3);
                      pTVar6->ptrs[uVar14] = ppcVar5;
                      if (ppcVar5 == (char **)0x0) goto LAB_001d7d1b;
                    }
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar8 != uVar16);
              }
              free(pTVar11->ptrs[uVar13]);
              pTVar11->ptrs[uVar13] = (char **)pTVar6;
              *piVar15 = -1;
              if ((char)uVar14 == '\0') break;
              piVar15 = pTVar6->counts + uVar14;
              uVar8 = pTVar6->counts[uVar14];
              pTVar11 = pTVar6;
              uVar13 = uVar14;
            } while (0x1fff < (int)uVar8);
          }
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != ((uint)scnt & 0x7fffffff));
  }
  bursttraverseA(node,strings,0,0);
  return;
}

Assistant:

void
burstsortA(string strings[], size_t scnt)
{
    TRIE	*root;

    root = (TRIE *) calloc(1, sizeof(TRIE));

    (void) burstinsertA(root, strings, scnt);
    (void) bursttraverseA(root, strings, 0, 0);

    return;
}